

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  NodeRef *pNVar5;
  NodeRef *pNVar6;
  NodeRef *pNVar7;
  int iVar8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  NodeRef *pNVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  NodeRef nodeRef;
  Primitive *pPVar30;
  size_t sVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  bool bVar33;
  byte bVar34;
  byte bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar78 [64];
  vint4 ai_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 ai;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 ai_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  vint4 ai_3;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined4 uVar101;
  vint4 bi_3;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  float fVar109;
  float fVar111;
  undefined1 auVar110 [64];
  float fVar112;
  float fVar114;
  vint4 bi_8;
  undefined1 auVar113 [64];
  float fVar115;
  float fVar118;
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  vbool<4>_conflict valid_leaf;
  Precalculations pre;
  int local_1728;
  int iStack_1724;
  int iStack_1720;
  int iStack_171c;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar82 [64];
  undefined1 auVar116 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar45 = in_ZMM0._0_16_;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar45 = vpcmpeqd_avx(auVar45,auVar45);
      uVar36 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
      stack_node[0xac].ptr = uVar36 & 0xf;
      if ((byte)stack_node[0xac].ptr != 0) {
        stack_node[0xab].ptr = (size_t)This->ptr;
        auVar43 = *(undefined1 (*) [16])(ray + 0x40);
        auVar70._8_4_ = 0x7fffffff;
        auVar70._0_8_ = 0x7fffffff7fffffff;
        auVar70._12_4_ = 0x7fffffff;
        auVar53 = vandps_avx(auVar43,auVar70);
        auVar46._8_4_ = 0x219392ef;
        auVar46._0_8_ = 0x219392ef219392ef;
        auVar46._12_4_ = 0x219392ef;
        uVar36 = vcmpps_avx512vl(auVar53,auVar46,1);
        auVar53 = *(undefined1 (*) [16])(ray + 0x50);
        auVar44 = vblendmps_avx512vl(auVar43,auVar46);
        bVar10 = (bool)((byte)uVar36 & 1);
        auVar39._0_4_ = (uint)bVar10 * auVar44._0_4_ | (uint)!bVar10 * in_XMM11_Da;
        bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * in_XMM11_Db;
        bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * in_XMM11_Dc;
        bVar10 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * in_XMM11_Dd;
        auVar44 = vandps_avx(auVar53,auVar70);
        uVar36 = vcmpps_avx512vl(auVar44,auVar46,1);
        bVar10 = (bool)((byte)uVar36 & 1);
        auVar41._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._0_4_;
        bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._4_4_;
        bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._8_4_;
        bVar10 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._12_4_;
        auVar53 = *(undefined1 (*) [16])(ray + 0x60);
        auVar44 = vandps_avx(auVar53,auVar70);
        uVar36 = vcmpps_avx512vl(auVar44,auVar46,1);
        bVar10 = (bool)((byte)uVar36 & 1);
        auVar52._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._0_4_;
        bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._4_4_;
        bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._8_4_;
        bVar10 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._12_4_;
        auVar44 = vrcp14ps_avx512vl(auVar39);
        auVar71._8_4_ = 0x3f800000;
        auVar71._0_8_ = &DAT_3f8000003f800000;
        auVar71._12_4_ = 0x3f800000;
        auVar70 = ZEXT816(0) << 0x40;
        auVar53 = vfnmadd213ps_fma(auVar39,auVar44,auVar71);
        auVar44 = vfmadd132ps_fma(auVar53,auVar44,auVar44);
        auVar106 = ZEXT1664(auVar44);
        auVar39 = vrcp14ps_avx512vl(auVar41);
        auVar53 = vfnmadd213ps_fma(auVar41,auVar39,auVar71);
        auVar39 = vfmadd132ps_fma(auVar53,auVar39,auVar39);
        auVar105 = ZEXT1664(auVar39);
        auVar41 = vrcp14ps_avx512vl(auVar52);
        auVar53 = vfnmadd213ps_fma(auVar52,auVar41,auVar71);
        auVar41 = vfmadd132ps_fma(auVar53,auVar41,auVar41);
        auVar107 = ZEXT1664(auVar41);
        auVar43 = vcmpps_avx(auVar43,auVar70,1);
        auVar53._8_4_ = 1;
        auVar53._0_8_ = 0x100000001;
        auVar53._12_4_ = 1;
        auVar52 = vandps_avx512vl(auVar43,auVar53);
        uVar36 = vcmpps_avx512vl(auVar70,*(undefined1 (*) [16])(ray + 0x50),0xe);
        auVar47._8_4_ = 2;
        auVar47._0_8_ = 0x200000002;
        auVar47._12_4_ = 2;
        auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70);
        stack_node[0xdc].ptr = auVar53._0_8_;
        stack_node[0xdd].ptr = auVar53._8_8_;
        auVar43 = vpsubd_avx512vl(auVar47,auVar43);
        bVar10 = (bool)((byte)uVar36 & 1);
        auVar66._0_4_ = (uint)bVar10 * auVar43._0_4_ | (uint)!bVar10 * auVar52._0_4_;
        bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar52._4_4_;
        bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar52._8_4_;
        bVar10 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar52._12_4_;
        uVar36 = vcmpps_avx512vl(auVar70,*(undefined1 (*) [16])(ray + 0x60),0xe);
        auVar43._8_4_ = 4;
        auVar43._0_8_ = 0x400000004;
        auVar43._12_4_ = 4;
        auVar43 = vpord_avx512vl(auVar66,auVar43);
        bVar10 = (bool)((byte)uVar36 & 1);
        auVar50._0_4_ = (uint)bVar10 * auVar43._0_4_ | !bVar10 * auVar66._0_4_;
        bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar10 * auVar43._4_4_ | !bVar10 * auVar66._4_4_;
        bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar10 * auVar43._8_4_ | !bVar10 * auVar66._8_4_;
        bVar10 = (bool)((byte)(uVar36 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar10 * auVar43._12_4_ | !bVar10 * auVar66._12_4_;
        auVar43 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar70);
        stack_node[0xda].ptr = auVar43._0_8_;
        stack_node[0xdb].ptr = auVar43._8_8_;
        auVar43 = vmovdqa32_avx512vl(auVar50);
        bVar10 = (bool)((byte)stack_node[0xac].ptr & 1);
        bVar33 = (bool)((byte)(stack_node[0xac].ptr >> 1) & 1);
        bVar12 = (bool)((byte)(stack_node[0xac].ptr >> 2) & 1);
        bVar13 = SUB81(stack_node[0xac].ptr >> 3,0);
        stack_node[0xd8].ptr._0_4_ = (uint)bVar10 * auVar43._0_4_ | (uint)!bVar10 * auVar45._0_4_;
        stack_node[0xd8].ptr._4_4_ = (uint)bVar33 * auVar43._4_4_ | (uint)!bVar33 * auVar45._4_4_;
        stack_node[0xd9].ptr._0_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar45._8_4_;
        stack_node[0xd9].ptr._4_4_ = (uint)bVar13 * auVar43._12_4_ | (uint)!bVar13 * auVar45._12_4_;
        stack_node[0xe2].ptr._0_4_ = *(float *)ray;
        stack_node[0xe2].ptr._4_4_ = *(float *)(ray + 4);
        stack_node[0xe3].ptr._0_4_ = *(float *)(ray + 8);
        stack_node[0xe3].ptr._4_4_ = *(float *)(ray + 0xc);
        fVar109 = auVar44._0_4_ * -*(float *)ray;
        fVar111 = auVar44._4_4_ * -*(float *)(ray + 4);
        auVar48._0_8_ = CONCAT44(fVar111,fVar109);
        auVar48._8_4_ = auVar44._8_4_ * -*(float *)(ray + 8);
        auVar48._12_4_ = auVar44._12_4_ * -*(float *)(ray + 0xc);
        auVar108 = ZEXT1664(auVar48);
        stack_node[0xe0].ptr._0_4_ = *(float *)(ray + 0x10);
        stack_node[0xe0].ptr._4_4_ = *(float *)(ray + 0x14);
        stack_node[0xe1].ptr._0_4_ = *(float *)(ray + 0x18);
        stack_node[0xe1].ptr._4_4_ = *(float *)(ray + 0x1c);
        fVar112 = auVar39._0_4_ * -*(float *)(ray + 0x10);
        fVar114 = auVar39._4_4_ * -*(float *)(ray + 0x14);
        auVar49._0_8_ = CONCAT44(fVar114,fVar112);
        auVar49._8_4_ = auVar39._8_4_ * -*(float *)(ray + 0x18);
        auVar49._12_4_ = auVar39._12_4_ * -*(float *)(ray + 0x1c);
        auVar110 = ZEXT1664(auVar49);
        stack_node[0xde].ptr._0_4_ = *(float *)(ray + 0x20);
        stack_node[0xde].ptr._4_4_ = *(float *)(ray + 0x24);
        stack_node[0xdf].ptr._0_4_ = *(float *)(ray + 0x28);
        stack_node[0xdf].ptr._4_4_ = *(float *)(ray + 0x2c);
        fVar115 = auVar41._0_4_ * -*(float *)(ray + 0x20);
        fVar118 = auVar41._4_4_ * -*(float *)(ray + 0x24);
        auVar116._0_8_ = CONCAT44(fVar118,fVar115);
        auVar116._8_4_ = auVar41._8_4_ * -*(float *)(ray + 0x28);
        auVar116._12_4_ = auVar41._12_4_ * -*(float *)(ray + 0x2c);
        auVar113 = ZEXT1664(auVar116);
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar117 = ZEXT1664(auVar45);
        stack_node[0xa5].ptr = 8;
        stack_node[0xae].ptr = (size_t)context;
        stack_node[0xad].ptr = (size_t)ray;
        stack_node[0xbc].ptr = auVar39._0_8_;
        stack_node[0xbd].ptr = auVar39._8_8_;
        stack_node[0xba].ptr = auVar44._0_8_;
        stack_node[0xbb].ptr = auVar44._8_8_;
        stack_node[0xb8].ptr = auVar41._0_8_;
        stack_node[0xb9].ptr = auVar41._8_8_;
        stack_node[0xb6].ptr = auVar48._0_8_;
        stack_node[0xb7].ptr = auVar48._8_8_;
        stack_node[0xb4].ptr = auVar49._0_8_;
        stack_node[0xb5].ptr = auVar49._8_8_;
        stack_node[0xb2].ptr = auVar116._0_8_;
        stack_node[0xb3].ptr = auVar116._8_8_;
        do {
          lVar25 = 0;
          for (uVar36 = stack_node[0xac].ptr; (uVar36 & 1) == 0;
              uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          iVar8 = *(int *)((long)&stack_node[0xd8].ptr + lVar25 * 4);
          auVar75._4_4_ = iVar8;
          auVar75._0_4_ = iVar8;
          auVar75._8_4_ = iVar8;
          auVar75._12_4_ = iVar8;
          auVar45._4_4_ = stack_node[0xd8].ptr._4_4_;
          auVar45._0_4_ = (uint)stack_node[0xd8].ptr;
          auVar45._8_4_ = (uint)stack_node[0xd9].ptr;
          auVar45._12_4_ = stack_node[0xd9].ptr._4_4_;
          uVar29 = vpcmpeqd_avx512vl(auVar75,auVar45);
          uVar29 = uVar29 & 0xf;
          bVar35 = (byte)uVar29;
          stack_node[0xac].ptr = (long)(char)~bVar35 & stack_node[0xac].ptr;
          auVar70 = auVar117._0_16_;
          auVar45 = vblendmps_avx512vl(auVar70,auVar106._0_16_);
          auVar44._0_4_ = (uint)(bVar35 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar35 & 1) * iVar8;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar44._4_4_ = (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * iVar8;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar44._8_4_ = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * iVar8;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar44._12_4_ = (uint)bVar10 * auVar45._12_4_ | (uint)!bVar10 * iVar8;
          auVar45 = vshufps_avx(auVar44,auVar44,0xb1);
          auVar45 = vminps_avx(auVar45,auVar44);
          auVar43 = vshufpd_avx(auVar45,auVar45,1);
          auVar45 = vminps_avx(auVar43,auVar45);
          auVar53 = vblendmps_avx512vl(auVar70,auVar105._0_16_);
          auVar54._0_4_ =
               (uint)(bVar35 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar54._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar54._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar54._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar43 = vminps_avx(auVar43,auVar54);
          auVar53 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar53,auVar43);
          auVar45 = vinsertps_avx(auVar45,auVar43,0x1c);
          auVar53 = vblendmps_avx512vl(auVar70,auVar107._0_16_);
          auVar55._0_4_ =
               (uint)(bVar35 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar55._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar55._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar55._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar43 = vminps_avx(auVar43,auVar55);
          auVar53 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar53,auVar43);
          auVar45 = vinsertps_avx(auVar45,auVar43,0x20);
          auVar104._8_4_ = 0xff800000;
          auVar104._0_8_ = 0xff800000ff800000;
          auVar104._12_4_ = 0xff800000;
          auVar53 = vblendmps_avx512vl(auVar104,auVar106._0_16_);
          auVar56._0_4_ =
               (uint)(bVar35 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar56._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar43 = vmaxps_avx(auVar43,auVar56);
          auVar53 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vmaxps_avx(auVar53,auVar43);
          auVar44 = vblendmps_avx512vl(auVar104,auVar105._0_16_);
          auVar57._0_4_ =
               (uint)(bVar35 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar53._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar57._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar53._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar57._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar53._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar57._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar53._12_4_;
          auVar53 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar53 = vmaxps_avx(auVar53,auVar57);
          auVar44 = vshufpd_avx(auVar53,auVar53,1);
          auVar53 = vmaxps_avx(auVar44,auVar53);
          auVar43 = vinsertps_avx(auVar43,auVar53,0x1c);
          auVar44 = vblendmps_avx512vl(auVar104,auVar107._0_16_);
          auVar58._0_4_ =
               (uint)(bVar35 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar53._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar53._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar53._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar58._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar53._12_4_;
          auVar53 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar53 = vmaxps_avx(auVar53,auVar58);
          auVar44 = vshufpd_avx(auVar53,auVar53,1);
          auVar53 = vmaxps_avx(auVar44,auVar53);
          auVar43 = vinsertps_avx(auVar43,auVar53,0x20);
          uVar36 = vcmpps_avx512vl(auVar45,ZEXT816(0) << 0x20,5);
          auVar53 = vblendmps_avx512vl(auVar43,auVar45);
          bVar34 = (byte)uVar36;
          fVar1 = (float)((uint)(bVar34 & 1) * auVar53._0_4_);
          fVar2 = (float)((uint)((byte)(uVar36 >> 1) & 1) * auVar53._4_4_);
          auVar59._4_4_ = fVar2;
          auVar59._0_4_ = fVar1;
          fVar3 = (float)((uint)((byte)(uVar36 >> 2) & 1) * auVar53._8_4_);
          auVar59._8_4_ = fVar3;
          fVar4 = (float)((uint)((byte)(uVar36 >> 3) & 1) * auVar53._12_4_);
          auVar59._12_4_ = fVar4;
          auVar53 = vmovshdup_avx(auVar59);
          stack_node[0xb1].ptr = (ulong)(auVar53._0_4_ < 0.0) << 4 | 0x20;
          auVar53 = vshufpd_avx(auVar59,auVar59,1);
          uVar37 = (ulong)(auVar53._0_4_ < 0.0) << 4 | 0x40;
          stack_node[0xb0].ptr = stack_node[0xb1].ptr ^ 0x10;
          auVar20._4_4_ = stack_node[0xe2].ptr._4_4_;
          auVar20._0_4_ = (float)stack_node[0xe2].ptr;
          auVar20._8_4_ = (float)stack_node[0xe3].ptr;
          auVar20._12_4_ = stack_node[0xe3].ptr._4_4_;
          auVar44 = vblendmps_avx512vl(auVar70,auVar20);
          auVar60._0_4_ =
               (uint)(bVar35 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar35 & 1) * (int)auVar53._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar60._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar53._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar60._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar53._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar60._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar53._12_4_;
          auVar53 = vshufps_avx(auVar60,auVar60,0xb1);
          auVar53 = vminps_avx(auVar53,auVar60);
          auVar44 = vshufpd_avx(auVar53,auVar53,1);
          auVar53 = vminps_avx(auVar44,auVar53);
          auVar19._4_4_ = stack_node[0xe0].ptr._4_4_;
          auVar19._0_4_ = (float)stack_node[0xe0].ptr;
          auVar19._8_4_ = (float)stack_node[0xe1].ptr;
          auVar19._12_4_ = stack_node[0xe1].ptr._4_4_;
          auVar39 = vblendmps_avx512vl(auVar70,auVar19);
          auVar61._0_4_ =
               (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar61._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar61._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar61._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar44 = vminps_avx(auVar44,auVar61);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vminps_avx(auVar39,auVar44);
          auVar53 = vinsertps_avx(auVar53,auVar44,0x1c);
          auVar18._4_4_ = stack_node[0xde].ptr._4_4_;
          auVar18._0_4_ = (float)stack_node[0xde].ptr;
          auVar18._8_4_ = (float)stack_node[0xdf].ptr;
          auVar18._12_4_ = stack_node[0xdf].ptr._4_4_;
          auVar39 = vblendmps_avx512vl(auVar70,auVar18);
          auVar62._0_4_ =
               (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar62._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar44 = vminps_avx(auVar44,auVar62);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vminps_avx(auVar39,auVar44);
          auVar53 = vinsertps_avx(auVar53,auVar44,0x20);
          auVar39 = vblendmps_avx512vl(auVar104,auVar20);
          auVar63._0_4_ =
               (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar63._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar63._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar63._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar44 = vmaxps_avx(auVar44,auVar63);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vmaxps_avx(auVar39,auVar44);
          auVar41 = vblendmps_avx512vl(auVar104,auVar19);
          auVar64._0_4_ =
               (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar39._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar39._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar64._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar39._12_4_;
          auVar39 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar39 = vmaxps_avx(auVar39,auVar64);
          auVar41 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxps_avx(auVar41,auVar39);
          auVar44 = vinsertps_avx(auVar44,auVar39,0x1c);
          auVar41 = vblendmps_avx512vl(auVar104,auVar18);
          auVar65._0_4_ =
               (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_;
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar65._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar39._4_4_;
          bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar65._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar39._8_4_;
          bVar10 = SUB81(uVar29 >> 3,0);
          auVar65._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar39._12_4_;
          auVar39 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar39 = vmaxps_avx(auVar39,auVar65);
          auVar41 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxps_avx(auVar41,auVar39);
          auVar44 = vinsertps_avx(auVar44,auVar39,0x20);
          auVar66 = vblendmps_avx512vl(auVar44,auVar53);
          bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar36 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar36 >> 3) & 1);
          bVar33 = (bool)((byte)(uVar36 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar36 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar41 = vblendmps_avx512vl(auVar104,stack_node._1744_16_);
          auVar67._0_4_ =
               (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * in_ZMM17._0_4_;
          bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar67._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * in_ZMM17._4_4_;
          bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar67._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * in_ZMM17._8_4_;
          bVar12 = SUB81(uVar29 >> 3,0);
          auVar67._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * in_ZMM17._12_4_;
          in_ZMM17 = ZEXT1664(auVar67);
          auVar41 = vshufps_avx512vl(auVar67,auVar67,0xb1);
          auVar50 = vmaxps_avx512vl(auVar41,auVar67);
          auVar52 = vshufpd_avx(auVar50,auVar50,1);
          auVar41 = vblendmps_avx512vl(auVar70,stack_node._1760_16_);
          auVar68._0_4_ =
               (uint)(bVar35 & 1) * auVar41._0_4_ |
               (uint)!(bool)(bVar35 & 1) * (int)(float)stack_node[0xe0].ptr;
          bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar68._4_4_ =
               (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * (int)stack_node[0xe0].ptr._4_4_;
          bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar68._8_4_ =
               (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * (int)(float)stack_node[0xe1].ptr;
          bVar12 = SUB81(uVar29 >> 3,0);
          auVar68._12_4_ =
               (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * (int)stack_node[0xe1].ptr._4_4_;
          auVar41 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar41 = vminps_avx(auVar41,auVar68);
          auVar52 = vmaxss_avx512f(auVar52,auVar50);
          auVar119 = ZEXT1664(auVar52);
          auVar69._0_4_ =
               (float)((uint)(bVar34 & 1) * auVar43._0_4_ |
                      (uint)!(bool)(bVar34 & 1) * auVar45._0_4_);
          bVar12 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar69._4_4_ = (float)((uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar45._4_4_);
          bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar69._8_4_ = (float)((uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar45._8_4_);
          bVar12 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar69._12_4_ = (float)((uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar45._12_4_);
          auVar85._0_4_ =
               (float)((uint)(bVar34 & 1) * auVar44._0_4_ |
                      (uint)!(bool)(bVar34 & 1) * auVar53._0_4_) * fVar1;
          auVar85._4_4_ =
               (float)((uint)bVar33 * auVar44._4_4_ | (uint)!bVar33 * auVar53._4_4_) * fVar2;
          auVar85._8_4_ =
               (float)((uint)bVar11 * auVar44._8_4_ | (uint)!bVar11 * auVar53._8_4_) * fVar3;
          auVar85._12_4_ =
               (float)((uint)bVar15 * auVar44._12_4_ | (uint)!bVar15 * auVar53._12_4_) * fVar4;
          auVar89._0_4_ =
               (float)((uint)(bVar34 & 1) * auVar66._0_4_ |
                      (uint)!(bool)(bVar34 & 1) * auVar39._0_4_) * auVar69._0_4_;
          auVar89._4_4_ =
               (float)((uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * auVar39._4_4_) * auVar69._4_4_
          ;
          auVar89._8_4_ =
               (float)((uint)bVar13 * auVar66._8_4_ | (uint)!bVar13 * auVar39._8_4_) * auVar69._8_4_
          ;
          auVar89._12_4_ =
               (float)((uint)bVar14 * auVar66._12_4_ | (uint)!bVar14 * auVar39._12_4_) *
               auVar69._12_4_;
          uVar36 = (ulong)(fVar1 < 0.0) * 0x10;
          stack_node[0xec].ptr = *(size_t *)(stack_node[0xab].ptr + 0x70);
          stack_node[0xed].ptr._0_4_ = 0;
          auVar43 = vbroadcastss_avx512vl(auVar59);
          auVar120 = ZEXT1664(auVar43);
          auVar93._4_4_ = auVar85._0_4_;
          auVar93._0_4_ = auVar85._0_4_;
          auVar93._8_4_ = auVar85._0_4_;
          auVar93._12_4_ = auVar85._0_4_;
          auVar96._8_4_ = 0x80000000;
          auVar96._0_8_ = 0x8000000080000000;
          auVar96._12_4_ = 0x80000000;
          auVar53 = vxorps_avx512vl(auVar93,auVar96);
          auVar78 = ZEXT1664(auVar53);
          auVar44 = vshufps_avx512vl(auVar59,auVar59,0x55);
          auVar121 = ZEXT1664(auVar44);
          auVar45 = vshufps_avx(auVar85,auVar85,0x55);
          auVar39 = vxorps_avx512vl(auVar45,auVar96);
          auVar122 = ZEXT1664(auVar39);
          auVar52 = vshufps_avx512vl(auVar59,auVar59,0xaa);
          auVar123 = ZEXT1664(auVar52);
          auVar45 = vshufps_avx(auVar85,auVar85,0xaa);
          auVar66 = vxorps_avx512vl(auVar45,auVar96);
          auVar124 = ZEXT1664(auVar66);
          auVar50 = vbroadcastss_avx512vl(auVar69);
          auVar125 = ZEXT1664(auVar50);
          auVar80._4_4_ = auVar89._0_4_;
          auVar80._0_4_ = auVar89._0_4_;
          auVar80._8_4_ = auVar89._0_4_;
          auVar80._12_4_ = auVar89._0_4_;
          auVar70 = vxorps_avx512vl(auVar80,auVar96);
          auVar126 = ZEXT1664(auVar70);
          auVar71 = vshufps_avx512vl(auVar69,auVar69,0x55);
          auVar127 = ZEXT1664(auVar71);
          auVar45 = vshufps_avx(auVar89,auVar89,0x55);
          auVar46 = vxorps_avx512vl(auVar45,auVar96);
          auVar128 = ZEXT1664(auVar46);
          auVar47 = vshufps_avx512vl(auVar69,auVar69,0xaa);
          auVar129 = ZEXT1664(auVar47);
          auVar45 = vshufps_avx(auVar89,auVar89,0xaa);
          auVar48 = vxorps_avx512vl(auVar45,auVar96);
          auVar130 = ZEXT1664(auVar48);
          uVar101 = auVar41._0_4_;
          auVar76._4_4_ = uVar101;
          auVar76._0_4_ = uVar101;
          auVar76._8_4_ = uVar101;
          auVar76._12_4_ = uVar101;
          auVar45 = vshufps_avx(auVar41,auVar41,0xaa);
          auVar45 = vminps_avx512vl(auVar45,auVar76);
          auVar131 = ZEXT1664(auVar45);
          auVar77._8_4_ = 0x7f800000;
          auVar77._0_8_ = 0x7f8000007f800000;
          auVar77._12_4_ = 0x7f800000;
          auVar41 = vpblendmd_avx512vl(auVar77,stack_node._1760_16_);
          bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
          bVar33 = (bool)((byte)(uVar29 >> 2) & 1);
          bVar12 = SUB81(uVar29 >> 3,0);
          stack_node[0xe8].ptr._0_4_ =
               (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * 0x7f800000;
          stack_node[0xe8].ptr._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * 0x7f800000;
          stack_node[0xe9].ptr._0_4_ = (uint)bVar33 * auVar41._8_4_ | (uint)!bVar33 * 0x7f800000;
          stack_node[0xe9].ptr._4_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * 0x7f800000;
          pNVar26 = stack_node + 0xee;
          stack_node[0xd6].ptr = auVar43._0_8_;
          stack_node[0xd7].ptr = auVar43._8_8_;
          stack_node[0xd4].ptr = auVar53._0_8_;
          stack_node[0xd5].ptr = auVar53._8_8_;
          stack_node[0xd2].ptr = auVar44._0_8_;
          stack_node[0xd3].ptr = auVar44._8_8_;
          stack_node[0xd0].ptr = auVar39._0_8_;
          stack_node[0xd1].ptr = auVar39._8_8_;
          stack_node[0xce].ptr = auVar52._0_8_;
          stack_node[0xcf].ptr = auVar52._8_8_;
          stack_node[0xcc].ptr = auVar66._0_8_;
          stack_node[0xcd].ptr = auVar66._8_8_;
          stack_node[0xca].ptr = auVar50._0_8_;
          stack_node[0xcb].ptr = auVar50._8_8_;
          stack_node[200].ptr = auVar70._0_8_;
          stack_node[0xc9].ptr = auVar70._8_8_;
          stack_node[0xc6].ptr = auVar71._0_8_;
          stack_node[199].ptr = auVar71._8_8_;
          stack_node[0xc4].ptr = auVar46._0_8_;
          stack_node[0xc5].ptr = auVar46._8_8_;
          stack_node[0xc2].ptr = auVar47._0_8_;
          stack_node[0xc3].ptr = auVar47._8_8_;
          stack_node[0xc0].ptr = auVar48._0_8_;
          stack_node[0xc1].ptr = auVar48._8_8_;
          stack_node[0xbe].ptr = auVar45._0_8_;
          stack_node[0xbf].ptr = auVar45._8_8_;
LAB_0078f65c:
          auVar43 = auVar119._0_16_;
          auVar45 = vbroadcastss_avx512vl(auVar43);
          while (pNVar26 != stack_node + 0xec) {
            uVar101 = (undefined4)pNVar26[-1].ptr;
            auVar81._4_4_ = uVar101;
            auVar81._0_4_ = uVar101;
            auVar81._8_4_ = uVar101;
            auVar81._12_4_ = uVar101;
            auVar82 = ZEXT1664(auVar81);
            pNVar26 = pNVar26 + -2;
            auVar53 = in_ZMM17._0_16_;
            uVar16 = vcmpps_avx512vl(auVar81,auVar53,1);
            if ((char)uVar16 != '\0') {
              sVar31 = pNVar26->ptr;
              do {
                if ((sVar31 & 8) != 0) {
                  uVar16 = vcmpps_avx512vl(auVar53,auVar82._0_16_,6);
                  stack_node[0xa8].ptr._0_1_ = (char)uVar16;
                  if ((char)uVar16 != '\0') {
                    stack_node[0xe4].ptr = auVar43._0_8_;
                    stack_node[0xe5].ptr = auVar43._8_8_;
                    stack_node[0xe6].ptr = auVar53._0_8_;
                    stack_node[0xe7].ptr = auVar53._8_8_;
                    stack_node[0xaf].ptr = (ulong)((uint)sVar31 & 0xf) - 8;
                    if (stack_node[0xaf].ptr != 0) {
                      pPVar30 = (Primitive *)(sVar31 & 0xfffffffffffffff0);
                      do {
                        stack_node[0xa5].ptr = 0x78f965;
                        InstanceIntersectorK<4>::intersect
                                  ((vbool<4>_conflict *)(stack_node + 0xa8),
                                   (Precalculations *)((long)&stack_node[0xa7].ptr + 7),ray,context,
                                   pPVar30);
                        pPVar30 = pPVar30 + 1;
                        stack_node[0xaf].ptr = stack_node[0xaf].ptr - 1;
                        context = (RayQueryContext *)stack_node[0xae];
                        ray = (RayHitK<4> *)stack_node[0xad];
                      } while (stack_node[0xaf].ptr != 0);
                    }
                    auVar45 = *(undefined1 (*) [16])(ray + 0x80);
                    uVar16 = vcmpps_avx512vl(auVar45,stack_node._1840_16_,1);
                    if (((byte)stack_node[0xa8].ptr & (byte)uVar16) == 0) {
                      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      stack_node[0xa5].ptr = 8;
                    }
                    else {
                      auVar72._0_4_ =
                           (uint)((byte)stack_node[0xa8].ptr & 1) * auVar45._0_4_ |
                           (uint)!(bool)((byte)stack_node[0xa8].ptr & 1) * (int)stack_node[0xe6].ptr
                      ;
                      bVar10 = (bool)((byte)stack_node[0xa8].ptr >> 1 & 1);
                      auVar72._4_4_ =
                           (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * stack_node[0xe6].ptr._4_4_
                      ;
                      bVar10 = (bool)((byte)stack_node[0xa8].ptr >> 2 & 1);
                      auVar72._8_4_ =
                           (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * (int)stack_node[0xe7].ptr;
                      bVar10 = (bool)((byte)stack_node[0xa8].ptr >> 3 & 1);
                      auVar72._12_4_ =
                           (uint)bVar10 * auVar45._12_4_ |
                           (uint)!bVar10 * stack_node[0xe7].ptr._4_4_;
                      auVar45 = vshufps_avx512vl(auVar72,auVar72,0xb1);
                      auVar43 = vmaxps_avx512vl(auVar45,auVar72);
                      auVar45 = vshufpd_avx(auVar43,auVar43,1);
                      stack_node._1824_16_ = vmaxss_avx512f(auVar45,auVar43);
                      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      stack_node[0xa5].ptr = 8;
                      stack_node._1840_16_ = auVar72;
                    }
                    auVar119 = ZEXT1664(stack_node._1824_16_);
                    in_ZMM17 = ZEXT1664(stack_node._1840_16_);
                    auVar117 = ZEXT1664(auVar45);
                    auVar113 = ZEXT1664(stack_node._1424_16_);
                    auVar110 = ZEXT1664(stack_node._1440_16_);
                    auVar108 = ZEXT1664(stack_node._1456_16_);
                    auVar107 = ZEXT1664(stack_node._1472_16_);
                    auVar106 = ZEXT1664(stack_node._1488_16_);
                    auVar105 = ZEXT1664(stack_node._1504_16_);
                    auVar120 = ZEXT1664(stack_node._1712_16_);
                    auVar78 = ZEXT1664(stack_node._1696_16_);
                    auVar121 = ZEXT1664(stack_node._1680_16_);
                    auVar122 = ZEXT1664(stack_node._1664_16_);
                    auVar123 = ZEXT1664(stack_node._1648_16_);
                    auVar124 = ZEXT1664(stack_node._1632_16_);
                    auVar125 = ZEXT1664(stack_node._1616_16_);
                    auVar126 = ZEXT1664(stack_node._1600_16_);
                    auVar127 = ZEXT1664(stack_node._1584_16_);
                    auVar128 = ZEXT1664(stack_node._1568_16_);
                    auVar129 = ZEXT1664(stack_node._1552_16_);
                    auVar130 = ZEXT1664(stack_node._1536_16_);
                    auVar131 = ZEXT1664(stack_node._1520_16_);
                  }
                  goto LAB_0078f65c;
                }
                auVar44 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + uVar36),auVar78._0_16_,
                                     auVar120._0_16_);
                auVar39 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + stack_node[0xb1].ptr),
                                     auVar122._0_16_,auVar121._0_16_);
                auVar44 = vpmaxsd_avx(auVar44,auVar39);
                auVar39 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + uVar37),auVar124._0_16_,
                                     auVar123._0_16_);
                auVar39 = vpmaxsd_avx512vl(auVar39,auVar131._0_16_);
                auVar44 = vpmaxsd_avx(auVar44,auVar39);
                auVar39 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + (uVar36 ^ 0x10)),
                                     auVar126._0_16_,auVar125._0_16_);
                auVar41 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + stack_node[0xb0].ptr),
                                     auVar128._0_16_,auVar127._0_16_);
                auVar39 = vpminsd_avx(auVar39,auVar41);
                auVar41 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(sVar31 + 0x20 + (uVar37 ^ 0x10)),
                                     auVar130._0_16_,auVar129._0_16_);
                auVar41 = vpminsd_avx(auVar41,auVar45);
                auVar39 = vpminsd_avx(auVar39,auVar41);
                stack_node[0xea].ptr = auVar44._0_8_;
                stack_node[0xeb].ptr = auVar44._8_8_;
                uVar29 = vcmpps_avx512vl(auVar44,auVar39,2);
                if ((char)uVar29 == '\0') {
                  bVar10 = false;
                  sVar24 = sVar31;
                }
                else {
                  auVar82 = ZEXT1664(auVar117._0_16_);
                  uVar28 = 0;
                  sVar23 = 8;
                  do {
                    lVar25 = 0;
                    for (uVar17 = uVar29; (uVar17 & 1) == 0;
                        uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    uVar101 = *(undefined4 *)(sVar31 + 0x20 + lVar25 * 4);
                    auVar86._4_4_ = uVar101;
                    auVar86._0_4_ = uVar101;
                    auVar86._8_4_ = uVar101;
                    auVar86._12_4_ = uVar101;
                    auVar41 = vfmadd132ps_fma(auVar86,auVar108._0_16_,auVar106._0_16_);
                    uVar101 = *(undefined4 *)(sVar31 + 0x40 + lVar25 * 4);
                    auVar90._4_4_ = uVar101;
                    auVar90._0_4_ = uVar101;
                    auVar90._8_4_ = uVar101;
                    auVar90._12_4_ = uVar101;
                    auVar52 = vfmadd132ps_fma(auVar90,auVar110._0_16_,auVar105._0_16_);
                    uVar101 = *(undefined4 *)(sVar31 + 0x60 + lVar25 * 4);
                    auVar94._4_4_ = uVar101;
                    auVar94._0_4_ = uVar101;
                    auVar94._8_4_ = uVar101;
                    auVar94._12_4_ = uVar101;
                    auVar66 = vfmadd132ps_fma(auVar94,auVar113._0_16_,auVar107._0_16_);
                    uVar101 = *(undefined4 *)(sVar31 + 0x30 + lVar25 * 4);
                    auVar97._4_4_ = uVar101;
                    auVar97._0_4_ = uVar101;
                    auVar97._8_4_ = uVar101;
                    auVar97._12_4_ = uVar101;
                    auVar50 = vfmadd132ps_fma(auVar97,auVar108._0_16_,auVar106._0_16_);
                    uVar101 = *(undefined4 *)(sVar31 + 0x50 + lVar25 * 4);
                    auVar100._4_4_ = uVar101;
                    auVar100._0_4_ = uVar101;
                    auVar100._8_4_ = uVar101;
                    auVar100._12_4_ = uVar101;
                    auVar70 = vfmadd132ps_fma(auVar100,auVar110._0_16_,auVar105._0_16_);
                    uVar101 = *(undefined4 *)(sVar31 + 0x70 + lVar25 * 4);
                    auVar103._4_4_ = uVar101;
                    auVar103._0_4_ = uVar101;
                    auVar103._8_4_ = uVar101;
                    auVar103._12_4_ = uVar101;
                    auVar71 = vfmadd132ps_fma(auVar103,auVar113._0_16_,auVar107._0_16_);
                    auVar44 = vpminsd_avx(auVar41,auVar50);
                    auVar39 = vpminsd_avx(auVar52,auVar70);
                    auVar44 = vpmaxsd_avx(auVar44,auVar39);
                    auVar39 = vpminsd_avx(auVar66,auVar71);
                    auVar21._4_4_ = stack_node[0xe8].ptr._4_4_;
                    auVar21._0_4_ = (uint)stack_node[0xe8].ptr;
                    auVar21._8_4_ = (uint)stack_node[0xe9].ptr;
                    auVar21._12_4_ = stack_node[0xe9].ptr._4_4_;
                    auVar39 = vpmaxsd_avx(auVar39,auVar21);
                    auVar44 = vpmaxsd_avx(auVar44,auVar39);
                    auVar39 = vpmaxsd_avx(auVar41,auVar50);
                    auVar41 = vpmaxsd_avx(auVar52,auVar70);
                    auVar41 = vpminsd_avx(auVar39,auVar41);
                    auVar39 = vpmaxsd_avx(auVar66,auVar71);
                    auVar39 = vpminsd_avx512vl(auVar39,auVar53);
                    auVar39 = vpminsd_avx(auVar41,auVar39);
                    uVar17 = vpcmpd_avx512vl(auVar44,auVar39,2);
                    sVar24 = sVar23;
                    if ((uVar17 & 0xf) != 0) {
                      uVar101 = *(undefined4 *)((long)&stack_node[0xea].ptr + lVar25 * 4);
                      auVar87._4_4_ = uVar101;
                      auVar87._0_4_ = uVar101;
                      auVar87._8_4_ = uVar101;
                      auVar87._12_4_ = uVar101;
                      sVar24 = *(size_t *)(sVar31 + lVar25 * 8);
                      auVar44 = auVar82._0_16_;
                      uVar16 = vcmpps_avx512vl(auVar87,auVar44,1);
                      if ((char)uVar16 == '\0') {
                        pNVar26->ptr = sVar24;
                        sVar24 = sVar23;
                      }
                      else {
                        if (sVar23 == 8) {
                          auVar82 = ZEXT1664(auVar87);
                          goto LAB_0078f81c;
                        }
                        pNVar26->ptr = sVar23;
                        auVar82 = ZEXT1664(auVar87);
                        auVar87 = auVar44;
                      }
                      uVar28 = uVar28 + 1;
                      *(int *)&pNVar26[1].ptr = auVar87._0_4_;
                      pNVar26 = pNVar26 + 2;
                    }
LAB_0078f81c:
                    uVar29 = uVar29 - 1 & uVar29;
                    sVar23 = sVar24;
                  } while (uVar29 != 0);
                  if (sVar24 == 8) {
                    bVar10 = false;
                  }
                  else {
                    bVar10 = true;
                    if (1 < uVar28) {
                      pNVar5 = pNVar26 + -4;
                      pNVar6 = pNVar26 + -2;
                      if ((uint)pNVar26[-3].ptr < (uint)pNVar26[-1].ptr) {
                        auVar44 = *(undefined1 (*) [16])pNVar5;
                        stack_node[0xa8].ptr = auVar44._0_8_;
                        stack_node[0xa9].ptr = auVar44._8_8_;
                        auVar39 = stack_node._1344_16_;
                        *(int *)&pNVar26[-3].ptr = (int)pNVar26[-1].ptr;
                        pNVar5->ptr = pNVar6->ptr;
                        stack_node[0xa8].ptr = auVar44._0_8_;
                        pNVar6->ptr = stack_node[0xa8].ptr;
                        stack_node[0xa9].ptr._0_4_ = auVar44._8_4_;
                        *(undefined4 *)&pNVar26[-1].ptr = (undefined4)stack_node[0xa9].ptr;
                        stack_node._1344_16_ = auVar39;
                      }
                      stack_node[0xa5].ptr = 8;
                      if (uVar28 != 2) {
                        pNVar7 = pNVar26 + -6;
                        if ((uint)pNVar26[-5].ptr < (uint)pNVar26[-1].ptr) {
                          auVar44 = *(undefined1 (*) [16])pNVar7;
                          stack_node[0xa8].ptr = auVar44._0_8_;
                          stack_node[0xa9].ptr = auVar44._8_8_;
                          auVar39 = stack_node._1344_16_;
                          *(int *)&pNVar26[-5].ptr = (int)pNVar26[-1].ptr;
                          pNVar7->ptr = pNVar6->ptr;
                          stack_node[0xa8].ptr = auVar44._0_8_;
                          pNVar6->ptr = stack_node[0xa8].ptr;
                          stack_node[0xa9].ptr._0_4_ = auVar44._8_4_;
                          *(undefined4 *)&pNVar26[-1].ptr = (undefined4)stack_node[0xa9].ptr;
                          stack_node._1344_16_ = auVar39;
                        }
                        stack_node[0xa5].ptr = 8;
                        if ((uint)pNVar26[-5].ptr < (uint)pNVar26[-3].ptr) {
                          auVar44 = *(undefined1 (*) [16])pNVar7;
                          stack_node[0xa8].ptr = auVar44._0_8_;
                          stack_node[0xa9].ptr = auVar44._8_8_;
                          auVar39 = stack_node._1344_16_;
                          *(int *)&pNVar26[-5].ptr = (int)pNVar26[-3].ptr;
                          pNVar7->ptr = pNVar5->ptr;
                          stack_node[0xa8].ptr = auVar44._0_8_;
                          pNVar5->ptr = stack_node[0xa8].ptr;
                          stack_node[0xa9].ptr._0_4_ = auVar44._8_4_;
                          *(undefined4 *)&pNVar26[-3].ptr = (undefined4)stack_node[0xa9].ptr;
                          stack_node._1344_16_ = auVar39;
                        }
                      }
                    }
                  }
                }
                sVar31 = sVar24;
              } while (bVar10);
            }
          }
        } while (stack_node[0xac].ptr != 0);
      }
      return;
    }
    auVar45 = vpcmpeqd_avx(auVar45,auVar45);
    uVar36 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
    uVar36 = uVar36 & 0xf;
    bVar34 = (byte)uVar36;
    if (bVar34 != 0) {
      auVar45 = *(undefined1 (*) [16])(ray + 0x40);
      auVar43 = *(undefined1 (*) [16])(ray + 0x50);
      auVar53 = *(undefined1 (*) [16])(ray + 0x60);
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx(auVar53,auVar83);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar44,auVar91,1);
      bVar10 = (bool)((byte)uVar29 & 1);
      auVar38._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._0_4_;
      bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._4_4_;
      bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._8_4_;
      bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar53._12_4_;
      auVar39 = vrcp14ps_avx512vl(auVar38);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = &DAT_3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar44 = vfnmadd213ps_fma(auVar38,auVar39,auVar98);
      auVar53 = vandps_avx(auVar43,auVar83);
      uVar29 = vcmpps_avx512vl(auVar53,auVar91,1);
      bVar10 = (bool)((byte)uVar29 & 1);
      auVar40._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._0_4_;
      bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._4_4_;
      bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._8_4_;
      bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._12_4_;
      auVar41 = vrcp14ps_avx512vl(auVar40);
      auVar53 = vfnmadd213ps_fma(auVar40,auVar41,auVar98);
      auVar43 = vandps_avx(auVar45,auVar83);
      uVar29 = vcmpps_avx512vl(auVar43,auVar91,1);
      bVar10 = (bool)((byte)uVar29 & 1);
      auVar42._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._0_4_;
      bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._4_4_;
      bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._8_4_;
      bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._12_4_;
      auVar43 = vrcp14ps_avx512vl(auVar42);
      auVar45 = vfnmadd213ps_fma(auVar42,auVar43,auVar98);
      auVar45 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
      auVar105 = ZEXT1664(auVar45);
      auVar43 = vfmadd132ps_fma(auVar53,auVar41,auVar41);
      auVar106 = ZEXT1664(auVar43);
      auVar53 = vfmadd132ps_fma(auVar44,auVar39,auVar39);
      auVar107 = ZEXT1664(auVar53);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar108 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar34 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000;
      bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * 0x7f800000;
      bVar10 = (bool)((byte)(uVar36 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * 0x7f800000;
      bVar10 = SUB81(uVar36 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * 0x7f800000;
      auVar110 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40);
      bVar10 = (bool)((byte)(uVar36 >> 1) & 1);
      bVar33 = (bool)((byte)(uVar36 >> 2) & 1);
      bVar12 = SUB81(uVar36 >> 3,0);
      auVar113 = ZEXT1664(CONCAT412((uint)bVar12 * auVar44._12_4_ | (uint)!bVar12 * -0x800000,
                                    CONCAT48((uint)bVar33 * auVar44._8_4_ |
                                             (uint)!bVar33 * -0x800000,
                                             CONCAT44((uint)bVar10 * auVar44._4_4_ |
                                                      (uint)!bVar10 * -0x800000,
                                                      (uint)(bVar34 & 1) * auVar44._0_4_ |
                                                      (uint)!(bool)(bVar34 & 1) * -0x800000))));
      pNVar26 = stack_node + 2;
      paVar32 = &stack_near[2].field_0;
      auVar117 = ZEXT1664(CONCAT412(auVar45._12_4_ * -*(float *)(ray + 0xc),
                                    CONCAT48(auVar45._8_4_ * -*(float *)(ray + 8),
                                             CONCAT44(auVar45._4_4_ * -*(float *)(ray + 4),
                                                      auVar45._0_4_ * -*(float *)ray))));
      auVar45 = *(undefined1 (*) [16])(ray + 0x10);
      auVar79._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar79._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar79._12_4_ = auVar45._12_4_ ^ 0x80000000;
      auVar45 = *(undefined1 (*) [16])(ray + 0x20);
      auVar73._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar73._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar73._12_4_ = auVar45._12_4_ ^ 0x80000000;
      auVar45 = vmulps_avx512vl(auVar43,auVar79);
      auVar119 = ZEXT1664(auVar45);
      auVar45 = vmulps_avx512vl(auVar53,auVar73);
      auVar120 = ZEXT1664(auVar45);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      do {
        paVar32 = paVar32 + -1;
        pNVar5 = pNVar26 + -1;
        pNVar26 = pNVar26 + -1;
        bVar10 = true;
        if (pNVar5->ptr != 0xfffffffffffffff8) {
          auVar78 = ZEXT1664((undefined1  [16])*paVar32);
          auVar45 = auVar113._0_16_;
          uVar16 = vcmpps_avx512vl((undefined1  [16])*paVar32,auVar45,1);
          sVar31 = pNVar5->ptr;
          if ((char)uVar16 != '\0') {
            do {
              auVar43 = auVar105._0_16_;
              auVar39 = auVar117._0_16_;
              auVar53 = auVar106._0_16_;
              auVar41 = auVar119._0_16_;
              auVar44 = auVar107._0_16_;
              auVar52 = auVar120._0_16_;
              if ((sVar31 & 8) != 0) {
                if (sVar31 == 0xfffffffffffffff8) goto LAB_0074bd06;
                uVar16 = vcmpps_avx512vl(auVar45,auVar78._0_16_,6);
                valid_leaf.v = (__mmask8)uVar16;
                if (valid_leaf.v != '\0') {
                  lVar25 = (ulong)((uint)sVar31 & 0xf) - 8;
                  if (lVar25 != 0) {
                    pPVar30 = (Primitive *)(sVar31 & 0xfffffffffffffff0);
                    do {
                      InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,pPVar30);
                      pPVar30 = pPVar30 + 1;
                      lVar25 = lVar25 + -1;
                    } while (lVar25 != 0);
                  }
                  local_1728 = auVar113._0_4_;
                  iStack_1724 = auVar113._4_4_;
                  iStack_1720 = auVar113._8_4_;
                  iStack_171c = auVar113._12_4_;
                  bVar10 = (bool)(valid_leaf.v >> 1 & 1);
                  bVar33 = (bool)(valid_leaf.v >> 2 & 1);
                  bVar12 = (bool)(valid_leaf.v >> 3 & 1);
                  auVar113 = ZEXT1664(CONCAT412((uint)bVar12 * *(int *)(ray + 0x8c) |
                                                (uint)!bVar12 * iStack_171c,
                                                CONCAT48((uint)bVar33 * *(int *)(ray + 0x88) |
                                                         (uint)!bVar33 * iStack_1720,
                                                         CONCAT44((uint)bVar10 *
                                                                  *(int *)(ray + 0x84) |
                                                                  (uint)!bVar10 * iStack_1724,
                                                                  (uint)(valid_leaf.v & 1) *
                                                                  *(int *)(ray + 0x80) |
                                                                  (uint)!(bool)(valid_leaf.v & 1) *
                                                                  local_1728))));
                  auVar105 = ZEXT1664(auVar43);
                  auVar106 = ZEXT1664(auVar53);
                  auVar107 = ZEXT1664(auVar44);
                  auVar108 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar110 = ZEXT1664(auVar110._0_16_);
                  auVar117 = ZEXT1664(auVar39);
                  auVar119 = ZEXT1664(auVar41);
                  auVar120 = ZEXT1664(auVar52);
                }
                break;
              }
              uVar29 = 0;
              auVar78 = ZEXT1664(auVar108._0_16_);
              uVar36 = 0;
              sVar24 = 8;
              do {
                sVar23 = *(size_t *)((sVar31 & 0xfffffffffffffff0) + uVar36 * 8);
                if (sVar23 != 8) {
                  uVar101 = *(undefined4 *)(sVar31 + 0x20 + uVar36 * 4);
                  auVar84._4_4_ = uVar101;
                  auVar84._0_4_ = uVar101;
                  auVar84._8_4_ = uVar101;
                  auVar84._12_4_ = uVar101;
                  auVar70 = vfmadd132ps_fma(auVar84,auVar39,auVar43);
                  uVar101 = *(undefined4 *)(sVar31 + 0x40 + uVar36 * 4);
                  auVar88._4_4_ = uVar101;
                  auVar88._0_4_ = uVar101;
                  auVar88._8_4_ = uVar101;
                  auVar88._12_4_ = uVar101;
                  auVar46 = vfmadd132ps_avx512vl(auVar88,auVar41,auVar53);
                  uVar101 = *(undefined4 *)(sVar31 + 0x60 + uVar36 * 4);
                  auVar92._4_4_ = uVar101;
                  auVar92._0_4_ = uVar101;
                  auVar92._8_4_ = uVar101;
                  auVar92._12_4_ = uVar101;
                  auVar47 = vfmadd132ps_avx512vl(auVar92,auVar52,auVar44);
                  uVar101 = *(undefined4 *)(sVar31 + 0x30 + uVar36 * 4);
                  auVar95._4_4_ = uVar101;
                  auVar95._0_4_ = uVar101;
                  auVar95._8_4_ = uVar101;
                  auVar95._12_4_ = uVar101;
                  auVar71 = vfmadd132ps_fma(auVar95,auVar39,auVar43);
                  uVar101 = *(undefined4 *)(sVar31 + 0x50 + uVar36 * 4);
                  auVar99._4_4_ = uVar101;
                  auVar99._0_4_ = uVar101;
                  auVar99._8_4_ = uVar101;
                  auVar99._12_4_ = uVar101;
                  auVar48 = vfmadd132ps_avx512vl(auVar99,auVar41,auVar53);
                  uVar101 = *(undefined4 *)(sVar31 + 0x70 + uVar36 * 4);
                  auVar102._4_4_ = uVar101;
                  auVar102._0_4_ = uVar101;
                  auVar102._8_4_ = uVar101;
                  auVar102._12_4_ = uVar101;
                  auVar49 = vfmadd132ps_avx512vl(auVar102,auVar52,auVar44);
                  auVar66 = vpminsd_avx(auVar70,auVar71);
                  auVar50 = vpminsd_avx(auVar46,auVar48);
                  auVar66 = vpmaxsd_avx(auVar66,auVar50);
                  auVar50 = vpminsd_avx(auVar47,auVar49);
                  auVar66 = vpmaxsd_avx(auVar66,auVar50);
                  auVar50 = vpmaxsd_avx(auVar70,auVar71);
                  auVar70 = vpmaxsd_avx(auVar46,auVar48);
                  auVar71 = vpminsd_avx(auVar50,auVar70);
                  auVar50 = vpmaxsd_avx(auVar47,auVar49);
                  auVar70 = vpmaxsd_avx(auVar66,auVar110._0_16_);
                  auVar50 = vpminsd_avx(auVar50,auVar45);
                  auVar50 = vpminsd_avx(auVar71,auVar50);
                  uVar37 = vpcmpd_avx512vl(auVar70,auVar50,2);
                  uVar37 = uVar37 & 0xf;
                  if ((byte)uVar37 != 0) {
                    auVar50 = vblendmps_avx512vl(auVar108._0_16_,auVar66);
                    bVar33 = (bool)((byte)uVar37 & 1);
                    aVar51._0_4_ = (uint)bVar33 * auVar50._0_4_ | (uint)!bVar33 * auVar66._0_4_;
                    bVar33 = (bool)((byte)(uVar37 >> 1) & 1);
                    aVar51._4_4_ = (uint)bVar33 * auVar50._4_4_ | (uint)!bVar33 * auVar66._4_4_;
                    bVar33 = (bool)((byte)(uVar37 >> 2) & 1);
                    aVar51._8_4_ = (uint)bVar33 * auVar50._8_4_ | (uint)!bVar33 * auVar66._8_4_;
                    bVar33 = SUB81(uVar37 >> 3,0);
                    aVar51._12_4_ = (uint)bVar33 * auVar50._12_4_ | (uint)!bVar33 * auVar66._12_4_;
                    aVar74 = auVar78._0_16_;
                    uVar16 = vcmpps_avx512vl((undefined1  [16])aVar51,(undefined1  [16])aVar74,1);
                    sVar27 = sVar23;
                    aVar9 = aVar74;
                    aVar22 = aVar51;
                    if (((char)uVar16 == '\0') ||
                       (bVar33 = sVar24 != 8, sVar27 = sVar24, sVar24 = sVar23, aVar9 = aVar51,
                       aVar22 = aVar74, bVar33)) {
                      uVar29 = uVar29 + 1;
                      pNVar26->ptr = sVar27;
                      pNVar26 = pNVar26 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar22;
                      paVar32 = paVar32 + 1;
                      auVar78 = ZEXT1664((undefined1  [16])aVar9);
                    }
                    else {
                      auVar78 = ZEXT1664((undefined1  [16])aVar51);
                    }
                  }
                }
              } while ((sVar23 != 8) && (bVar33 = uVar36 < 3, uVar36 = uVar36 + 1, bVar33));
              if (1 < uVar29 && sVar24 != 8) {
                aVar9 = paVar32[-2];
                uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar32[-1],1);
                if ((char)uVar16 != '\0') {
                  paVar32[-2] = paVar32[-1];
                  paVar32[-1] = aVar9;
                  auVar43 = vpermilps_avx(*(undefined1 (*) [16])(pNVar26 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar26 + -2) = auVar43;
                }
                if (uVar29 != 2) {
                  aVar9 = paVar32[-3];
                  uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar32[-1],1);
                  if ((char)uVar16 != '\0') {
                    paVar32[-3] = paVar32[-1];
                    paVar32[-1] = aVar9;
                    sVar31 = pNVar26[-3].ptr;
                    pNVar26[-3].ptr = pNVar26[-1].ptr;
                    pNVar26[-1].ptr = sVar31;
                  }
                  aVar9 = paVar32[-3];
                  uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar32[-2],1);
                  if ((char)uVar16 != '\0') {
                    paVar32[-3] = paVar32[-2];
                    paVar32[-2] = aVar9;
                    auVar43 = vpermilps_avx(*(undefined1 (*) [16])(pNVar26 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar26 + -3) = auVar43;
                  }
                }
              }
              sVar31 = sVar24;
            } while (sVar24 != 8);
          }
          bVar10 = false;
        }
LAB_0074bd06:
      } while (!bVar10);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }